

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathLibrary.cpp
# Opt level: O3

double Js::Math::Log10(double x)

{
  double dVar1;
  
  dVar1 = log10(x);
  return dVar1;
}

Assistant:

double Math::Log10(double x)
    {
        double result;

#if defined(_M_IX86) && defined(_WIN32)
        // This is for perf, not for functionality
        // If non Win32 CRT implementation already support SSE2,
        // then we get most of the perf already.
        if (AutoSystemInfo::Data.SSE2Available())
        {
            _asm {
                movsd xmm0, x
                call dword ptr [__libm_sse2_log10]
                movsd result, xmm0
            }
        }
        else
#endif
        {
            result = ::log10(x);
        }

        return result;
    }